

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

void tmiss(obj *obj,monst *mon)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *missile;
  monst *mon_local;
  obj *obj_local;
  
  pcVar3 = mshot_xname(obj);
  if (mon->wormno == '\0') {
    if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_001b17f9;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((mon->data->mflags3 & 0x200) != 0)))) {
      bVar1 = viz_array[mon->my][mon->mx] & 1;
      goto joined_r0x001b17f3;
    }
  }
  else {
    bVar1 = worm_known(level,mon);
joined_r0x001b17f3:
    if (bVar1 != 0) {
LAB_001b17f9:
      if ((((((*(uint *)&mon->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&mon->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mon->field_0x60 >> 9 & 1) == 0)
           ) && ((((byte)u._1052_1_ >> 5 & 1) == 0 &&
                 ((mon->m_ap_type == '\0' || (mon->m_ap_type == '\x03')))))))) {
        miss(pcVar3,mon);
        goto LAB_001b18dd;
      }
    }
  }
  pcVar3 = The(pcVar3);
  pcVar4 = otense(obj,"miss");
  pline("%s %s.",pcVar3,pcVar4);
LAB_001b18dd:
  iVar2 = rn2(3);
  if (iVar2 == 0) {
    wakeup(mon);
  }
  return;
}

Assistant:

static void tmiss(struct obj *obj, struct monst *mon)
{
    const char *missile = mshot_xname(obj);

    /* If the target can't be seen or doesn't look like a valid target,
       avoid "the arrow misses it," or worse, "the arrows misses the mimic."
       An attentive player will still notice that this is different from
       an arrow just landing short of any target (no message in that case),
       so will realize that there is a valid target here anyway. */
    if (!canseemon(level, mon) || (mon->m_ap_type && mon->m_ap_type != M_AP_MONSTER))
	pline("%s %s.", The(missile), otense(obj, "miss"));
    else
	miss(missile, mon);
    if (!rn2(3)) wakeup(mon);
    return;
}